

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::clearLPReal(SoPlexBase<double> *this)

{
  undefined1 *puVar1;
  EVP_PKEY_CTX *in_RSI;
  
  (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])();
  this->_hasBasis = false;
  if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
    SLUFactorRational::init(&this->_rationalLUSolver,in_RSI);
  }
  if (this->_currentSettings->_intParamValues[0xf] == 1) {
    (*(this->_rationalLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x1b])();
    (this->_rowTypes).thesize = 0;
    (this->_colTypes).thesize = 0;
  }
  this->_status = UNKNOWN;
  puVar1 = &(this->_solReal).field_0x98;
  *puVar1 = *puVar1 & 0xf0;
  this->_hasSolReal = false;
  this->_hasSolRational = false;
  puVar1 = &(this->_solRational).field_0xd0;
  *puVar1 = *puVar1 & 0xf0;
  return;
}

Assistant:

void SoPlexBase<R>::clearLPReal()
{
   assert(_realLP != nullptr);

   _realLP->clear();
   _hasBasis = false;
   _rationalLUSolver.clear();

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->clear();
      _rowTypes.clear();
      _colTypes.clear();
   }

   _invalidateSolution();
}